

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuiteTest.h
# Opt level: O0

void __thiscall
oout::SuiteTest::SuiteTest<oout::Test_const,oout::NamedTest>
          (SuiteTest *this,shared_ptr<const_oout::Test> *test1,shared_ptr<const_oout::Test> *tests,
          shared_ptr<oout::NamedTest> *tests_1)

{
  initializer_list<std::shared_ptr<const_oout::Test>_> __l;
  shared_ptr<const_oout::Test> *local_b8;
  allocator<std::shared_ptr<const_oout::Test>_> local_81;
  shared_ptr<const_oout::Test> local_80;
  shared_ptr<const_oout::Test> local_70;
  shared_ptr<oout::Test_const> local_60 [16];
  shared_ptr<const_oout::Test> local_50;
  list<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
  local_40;
  shared_ptr<oout::NamedTest> *local_28;
  shared_ptr<oout::NamedTest> *tests_local_1;
  shared_ptr<const_oout::Test> *tests_local;
  shared_ptr<const_oout::Test> *test1_local;
  SuiteTest *this_local;
  
  local_28 = tests_1;
  tests_local_1 = (shared_ptr<oout::NamedTest> *)tests;
  tests_local = test1;
  test1_local = (shared_ptr<const_oout::Test> *)this;
  std::shared_ptr<const_oout::Test>::shared_ptr(&local_80,test1);
  std::shared_ptr<const_oout::Test>::shared_ptr
            (&local_70,(shared_ptr<const_oout::Test> *)tests_local_1);
  std::shared_ptr<oout::Test_const>::shared_ptr<oout::NamedTest,void>(local_60,local_28);
  local_50.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3;
  local_50.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_80;
  std::allocator<std::shared_ptr<const_oout::Test>_>::allocator(&local_81);
  __l._M_len = (size_type)
               local_50.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi;
  __l._M_array = (iterator)
                 local_50.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::
  list<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>::list
            (&local_40,__l,&local_81);
  SuiteTest(this,&local_40);
  std::__cxx11::
  list<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>::
  ~list(&local_40);
  std::allocator<std::shared_ptr<const_oout::Test>_>::~allocator(&local_81);
  local_b8 = &local_50;
  do {
    local_b8 = local_b8 + -1;
    std::shared_ptr<const_oout::Test>::~shared_ptr(local_b8);
  } while (local_b8 != &local_80);
  return;
}

Assistant:

explicit SuiteTest(
			const std::shared_ptr<const Test> &test1,
			const std::shared_ptr<T> & ... tests
		) : SuiteTest(std::list<std::shared_ptr<const Test>>{
			test1, tests...
		})
	{
	}